

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O3

void complete_delete_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  size_t sVar3;
  fdb_config *__ptr;
  size_t metalen;
  size_t bodylen;
  char *pcVar4;
  uint uVar5;
  ulong unaff_RBP;
  fdb_file_handle **ptr_fhandle;
  ulong uVar6;
  fdb_config *pfVar7;
  char *kvs_config;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *fit;
  timeval __test_begin;
  char valuebuf [256];
  char keybuf [256];
  char path [256];
  fdb_doc *pfStack_b50;
  fdb_kvs_handle *pfStack_b48;
  fdb_file_handle *pfStack_b40;
  timeval tStack_b38;
  fdb_kvs_config fStack_b28;
  fdb_config fStack_b10;
  char acStack_a18 [256];
  char *pcStack_918;
  fdb_config *pfStack_910;
  fdb_config *pfStack_908;
  fdb_file_handle *pfStack_8f8;
  fdb_kvs_handle *pfStack_8f0;
  fdb_kvs_config fStack_8e8;
  timeval tStack_8d0;
  char acStack_8c0 [264];
  fdb_config fStack_7b8;
  char acStack_6c0 [256];
  char acStack_5c0 [264];
  char *pcStack_4b8;
  fdb_file_handle **ppfStack_4b0;
  fdb_config *pfStack_4a0;
  fdb_kvs_config *pfStack_498;
  code *pcStack_490;
  fdb_kvs_handle *local_478;
  fdb_file_handle *local_470;
  fdb_iterator *local_468;
  timeval local_460;
  fdb_kvs_config local_450;
  fdb_file_handle *local_438 [32];
  fdb_config local_338;
  fdb_config local_230;
  char local_138 [264];
  
  pcStack_490 = (code *)0x110b88;
  gettimeofday(&local_460,(__timezone_ptr_t)0x0);
  pcStack_490 = (code *)0x110b8d;
  memleak_start();
  pcVar4 = local_138;
  builtin_strncpy(local_138,"./dummy1",9);
  pcStack_490 = (code *)0x110bb2;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar7 = &local_230;
  pcStack_490 = (code *)0x110bc2;
  fdb_get_default_config();
  local_230.buffercache_size = 0;
  kvs_config = &local_450.create_if_missing;
  pcStack_490 = (code *)0x110bd7;
  fdb_get_default_kvs_config();
  ptr_fhandle = &local_470;
  pcStack_490 = (code *)0x110bea;
  fdb_open(ptr_fhandle,pcVar4,pfVar7);
  pcStack_490 = (code *)0x110c02;
  fVar2 = fdb_kvs_open(local_470,&local_478,"db1",(fdb_kvs_config *)kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d9c;
  unaff_RBP = 0;
  do {
    pcStack_490 = (code *)0x110c33;
    sprintf((char *)&local_338,"key%05d",unaff_RBP);
    pcStack_490 = (code *)0x110c42;
    sprintf((char *)local_438,"value%05d",unaff_RBP);
    pfVar1 = local_478;
    pcStack_490 = (code *)0x110c4f;
    sVar3 = strlen((char *)&local_338);
    pcVar4 = (char *)(sVar3 + 1);
    pcStack_490 = (code *)0x110c5b;
    sVar3 = strlen((char *)local_438);
    pcStack_490 = (code *)0x110c70;
    fVar2 = fdb_set_kv(pfVar1,&local_338,(size_t)pcVar4,local_438,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_490 = (code *)0x110d97;
      complete_delete_test();
      goto LAB_00110d97;
    }
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_490 = (code *)0x110c91;
  fdb_commit(local_470,'\x01');
  pcVar4 = "key%05d";
  pfVar7 = &local_338;
  kvs_config = "value%05d";
  ptr_fhandle = local_438;
  unaff_RBP = 0;
  do {
    pcStack_490 = (code *)0x110cbd;
    sprintf((char *)pfVar7,"key%05d",unaff_RBP);
    pcStack_490 = (code *)0x110ccc;
    sprintf((char *)ptr_fhandle,"value%05d",unaff_RBP);
    pfVar1 = local_478;
    pcStack_490 = (code *)0x110cd9;
    sVar3 = strlen((char *)pfVar7);
    pcStack_490 = (code *)0x110ce8;
    fVar2 = fdb_del_kv(pfVar1,pfVar7,sVar3 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110d97;
    uVar5 = (int)unaff_RBP + 1;
    unaff_RBP = (ulong)uVar5;
  } while (uVar5 != 1000);
  pcStack_490 = (code *)0x110d09;
  fdb_commit(local_470,'\x01');
  pcStack_490 = (code *)0x110d29;
  fVar2 = fdb_iterator_init(local_478,&local_468,(void *)0x0,0,(void *)0x0,0,2);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110da1;
  pcStack_490 = (code *)0x110d37;
  fVar2 = fdb_iterator_close(local_468);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_490 = (code *)0x110d45;
    fdb_close(local_470);
    pcStack_490 = (code *)0x110d4a;
    fdb_shutdown();
    pcStack_490 = (code *)0x110d4f;
    memleak_end();
    pcVar4 = "%s PASSED\n";
    if (complete_delete_test()::__test_pass != '\0') {
      pcVar4 = "%s FAILED\n";
    }
    pcStack_490 = (code *)0x110d80;
    fprintf(_stderr,pcVar4,"complete delete");
    return;
  }
  goto LAB_00110da6;
LAB_00110d97:
  pfVar7 = &local_338;
  ptr_fhandle = local_438;
  kvs_config = "value%05d";
  pcStack_490 = (code *)0x110d9c;
  complete_delete_test();
LAB_00110d9c:
  pcStack_490 = (code *)0x110da1;
  complete_delete_test();
LAB_00110da1:
  pcStack_490 = (code *)0x110da6;
  complete_delete_test();
LAB_00110da6:
  pcStack_490 = large_batch_write_no_commit_test;
  complete_delete_test();
  pfStack_908 = (fdb_config *)0x110dc8;
  pcStack_4b8 = pcVar4;
  ppfStack_4b0 = ptr_fhandle;
  pfStack_4a0 = pfVar7;
  pfStack_498 = (fdb_kvs_config *)kvs_config;
  pcStack_490 = (code *)unaff_RBP;
  gettimeofday(&tStack_8d0,(__timezone_ptr_t)0x0);
  pfStack_908 = (fdb_config *)0x110dcd;
  memleak_start();
  pfStack_908 = (fdb_config *)0x110dd7;
  __ptr = (fdb_config *)malloc(4000000);
  pfStack_908 = (fdb_config *)0x110de6;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar7 = &fStack_7b8;
  pfStack_908 = (fdb_config *)0x110df6;
  fdb_get_default_config();
  pfStack_908 = (fdb_config *)0x110e00;
  fdb_get_default_kvs_config();
  pfStack_908 = (fdb_config *)0x110e14;
  fVar2 = fdb_open(&pfStack_8f8,"./dummy1",pfVar7);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pfStack_908 = (fdb_config *)0x110e32;
    fVar2 = fdb_kvs_open(pfStack_8f8,&pfStack_8f0,(char *)0x0,&fStack_8e8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fb7;
    pcVar4 = (char *)0x0;
    uVar6 = 0;
    do {
      pfStack_908 = (fdb_config *)0x110e5b;
      sprintf(acStack_5c0,"key%128d",uVar6 & 0xffffffff);
      pfStack_908 = (fdb_config *)0x110e77;
      sprintf(acStack_6c0,"meta%128d",uVar6 & 0xffffffff);
      pfStack_908 = (fdb_config *)0x110e8d;
      sprintf(acStack_8c0,"body%128d",uVar6 & 0xffffffff);
      pfStack_908 = (fdb_config *)0x110e99;
      sVar3 = strlen(acStack_5c0);
      pfStack_908 = (fdb_config *)0x110ea7;
      metalen = strlen(acStack_6c0);
      pfStack_908 = (fdb_config *)0x110eb4;
      bodylen = strlen(acStack_8c0);
      pfStack_908 = (fdb_config *)0x110ede;
      fdb_doc_create((fdb_doc **)(pcVar4 + (long)&__ptr->chunksize),acStack_5c0,sVar3,acStack_6c0,
                     metalen,acStack_8c0,bodylen);
      pfStack_908 = (fdb_config *)0x110eec;
      fdb_set(pfStack_8f0,*(fdb_doc **)(&__ptr->chunksize + uVar6 * 4));
      pfStack_908 = (fdb_config *)0x110ef5;
      fdb_doc_free(*(fdb_doc **)(&__ptr->chunksize + uVar6 * 4));
      uVar6 = uVar6 + 1;
      pcVar4 = pcVar4 + 8;
    } while (uVar6 != 500000);
    pfStack_908 = (fdb_config *)0x110f13;
    fVar2 = fdb_kvs_close(pfStack_8f0);
    pfVar7 = __ptr;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fbc;
    pfStack_908 = (fdb_config *)0x110f25;
    fVar2 = fdb_close(pfStack_8f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00110fc1;
    pfStack_908 = (fdb_config *)0x110f46;
    fVar2 = fdb_open(&pfStack_8f8,"./dummy1",&fStack_7b8);
    if (fVar2 == FDB_RESULT_NO_DB_HEADERS) {
LAB_00110f5d:
      pfStack_908 = (fdb_config *)0x110f65;
      free(__ptr);
      pfStack_908 = (fdb_config *)0x110f6a;
      fdb_shutdown();
      pfStack_908 = (fdb_config *)0x110f6f;
      memleak_end();
      pcVar4 = "%s PASSED\n";
      if (large_batch_write_no_commit_test()::__test_pass != '\0') {
        pcVar4 = "%s FAILED\n";
      }
      pfStack_908 = (fdb_config *)0x110fa0;
      fprintf(_stderr,pcVar4,"large batch write test with no commits");
      return;
    }
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pfStack_908 = (fdb_config *)0x110f59;
      fVar2 = fdb_close(pfStack_8f8);
      if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      goto LAB_00110fcb;
    }
  }
  else {
    pfStack_908 = (fdb_config *)0x110fb7;
    large_batch_write_no_commit_test();
LAB_00110fb7:
    pfStack_908 = (fdb_config *)0x110fbc;
    large_batch_write_no_commit_test();
LAB_00110fbc:
    pfStack_908 = (fdb_config *)0x110fc1;
    large_batch_write_no_commit_test();
LAB_00110fc1:
    pfStack_908 = (fdb_config *)0x110fc6;
    large_batch_write_no_commit_test();
  }
  pfStack_908 = (fdb_config *)0x110fcb;
  large_batch_write_no_commit_test();
LAB_00110fcb:
  pfStack_908 = (fdb_config *)set_get_meta_test;
  large_batch_write_no_commit_test();
  pcStack_918 = pcVar4;
  pfStack_910 = pfVar7;
  pfStack_908 = __ptr;
  gettimeofday(&tStack_b38,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_b10.wal_threshold = 0x400;
  fStack_b10.seqtree_opt = '\x01';
  fStack_b10.purging_interval = 1;
  fStack_b10.flags = 1;
  system("rm -rf  dummy* > errorlog.txt");
  fdb_open(&pfStack_b40,"./dummy1",&fStack_b10);
  fdb_kvs_open(pfStack_b40,&pfStack_b48,"db1",&fStack_b28);
  sprintf(acStack_a18,"key%d",0);
  sVar3 = strlen(acStack_a18);
  fdb_doc_create(&pfStack_b50,acStack_a18,sVar3,(void *)0x0,0,(void *)0x0,0);
  fdb_set(pfStack_b48,pfStack_b50);
  fVar2 = fdb_get(pfStack_b48,pfStack_b50);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                  ,0x345,"void set_get_meta_test()");
  }
  fVar2 = fdb_get_byoffset(pfStack_b48,pfStack_b50);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_get_metaonly(pfStack_b48,pfStack_b50);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_get_metaonly_byseq(pfStack_b48,pfStack_b50);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_del(pfStack_b48,pfStack_b50);
        fVar2 = fdb_get(pfStack_b48,pfStack_b50);
        if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
          if (pfStack_b50->deleted == false) {
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x350,"void set_get_meta_test()");
          }
          fVar2 = fdb_get_metaonly(pfStack_b48,pfStack_b50);
          if (fVar2 == FDB_RESULT_SUCCESS) {
            if (pfStack_b50->deleted == false) {
              __assert_fail("rdoc->deleted == true",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                            ,0x354,"void set_get_meta_test()");
            }
            fVar2 = fdb_get_metaonly_byseq(pfStack_b48,pfStack_b50);
            if (fVar2 == FDB_RESULT_SUCCESS) {
              if (pfStack_b50->deleted != false) {
                fVar2 = fdb_get_byoffset(pfStack_b48,pfStack_b50);
                if (fVar2 == FDB_RESULT_KEY_NOT_FOUND) {
                  if (pfStack_b50->deleted != false) {
                    fdb_doc_free(pfStack_b50);
                    fdb_kvs_close(pfStack_b48);
                    fdb_close(pfStack_b40);
                    fdb_shutdown();
                    memleak_end();
                    pcVar4 = "%s PASSED\n";
                    if (set_get_meta_test()::__test_pass != '\0') {
                      pcVar4 = "%s FAILED\n";
                    }
                    fprintf(_stderr,pcVar4,"set get meta test");
                    return;
                  }
                }
                else {
                  set_get_meta_test();
                }
                __assert_fail("rdoc->deleted == true",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                              ,0x35c,"void set_get_meta_test()");
              }
            }
            else {
              set_get_meta_test();
            }
            __assert_fail("rdoc->deleted == true",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                          ,0x358,"void set_get_meta_test()");
          }
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x353,"void set_get_meta_test()");
        }
      }
      else {
        set_get_meta_test();
      }
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x34f,"void set_get_meta_test()");
    }
  }
  else {
    set_get_meta_test();
  }
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x349,"void set_get_meta_test()");
}

Assistant:

void complete_delete_test()
{
    TEST_INIT();

    int i, r, n = 1000;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_iterator *fit;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_status s; (void)s;
    char path[256];
    char keybuf[256], valuebuf[256];

    memleak_start();

    sprintf(path, "./dummy1");

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    kvs_config = fdb_get_default_kvs_config();

    fdb_open(&dbfile, path, &config);
    s = fdb_kvs_open(dbfile, &db, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%05d", i);
        sprintf(valuebuf, "value%05d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1, valuebuf, strlen(valuebuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    for (i=0;i<n;++i){
        sprintf(keybuf, "key%05d", i);
        sprintf(valuebuf, "value%05d", i);
        s = fdb_del_kv(db, keybuf, strlen(keybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    s = fdb_iterator_init(db, &fit, NULL, 0, NULL, 0, FDB_ITR_NO_DELETES);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_iterator_close(fit);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("complete delete");
}